

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

string * SettingName(string *arg)

{
  size_type sVar1;
  const_reference pvVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000018;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000020;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__n;
  size_type __pos;
  
  __pos = *(size_type *)(in_FS_OFFSET + 0x28);
  __n = in_RDI;
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (in_RDI);
  if (sVar1 != 0) {
    pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](in_RSI,(size_type)in_RDI);
    if (*pvVar2 == '-') {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (unaff_retaddr,__pos,(size_type)__n);
      goto LAB_0060b308;
    }
  }
  std::__cxx11::string::string(in_stack_00000020,in_stack_00000018);
LAB_0060b308:
  if (*(size_type *)(in_FS_OFFSET + 0x28) == __pos) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static std::string SettingName(const std::string& arg)
{
    return arg.size() > 0 && arg[0] == '-' ? arg.substr(1) : arg;
}